

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool __thiscall
cmLocalGenerator::GetShouldUseOldFlags(cmLocalGenerator *this,bool shared,string *lang)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *__lhs;
  ostream *poVar3;
  PolicyID id;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  ostringstream e;
  char *flags;
  allocator local_69;
  undefined1 local_68 [8];
  string flagsVar;
  string originalFlags;
  string *lang_local;
  bool shared_local;
  cmLocalGenerator *this_local;
  
  cmGlobalGenerator::GetSharedLibFlagsForLanguage
            ((string *)((long)&flagsVar.field_2 + 8),this->GlobalGenerator,lang);
  if (shared) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_68,"CMAKE_SHARED_LIBRARY_",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::operator+=((string *)local_68,(string *)lang);
    std::__cxx11::string::operator+=((string *)local_68,"_FLAGS");
    __lhs = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_68);
    if ((__lhs == (char *)0x0) ||
       (bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&flagsVar.field_2 + 8)), !bVar1)) {
LAB_0073a804:
      bVar1 = false;
    }
    else {
      PVar2 = GetPolicyStatus(this,CMP0018);
      if (PVar2 != OLD) {
        if (PVar2 != WARN) {
          if (2 < PVar2 - NEW) goto LAB_0073a804;
          this_local._7_1_ = 0;
          bVar1 = true;
          goto LAB_0073a80e;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
        poVar3 = std::operator<<((ostream *)local_200,"Variable ");
        poVar3 = std::operator<<(poVar3,(string *)local_68);
        poVar3 = std::operator<<(poVar3,
                                 " has been modified. CMake will ignore the POSITION_INDEPENDENT_CODE target property for shared libraries and will use the "
                                );
        poVar3 = std::operator<<(poVar3,(string *)local_68);
        poVar3 = std::operator<<(poVar3,
                                 " variable instead.  This may cause errors if the original content of "
                                );
        poVar3 = std::operator<<(poVar3,(string *)local_68);
        poVar3 = std::operator<<(poVar3," was removed.\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_220,(cmPolicies *)0x12,id);
        std::operator<<(poVar3,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::ostringstream::str();
        IssueMessage(this,AUTHOR_WARNING,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      }
      this_local._7_1_ = 1;
      bVar1 = true;
    }
LAB_0073a80e:
    std::__cxx11::string::~string((string *)local_68);
    if (bVar1) goto LAB_0073a83e;
  }
  this_local._7_1_ = 0;
LAB_0073a83e:
  std::__cxx11::string::~string((string *)(flagsVar.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmLocalGenerator::GetShouldUseOldFlags(bool shared,
                                            const std::string& lang) const
{
  std::string originalFlags =
    this->GlobalGenerator->GetSharedLibFlagsForLanguage(lang);
  if (shared) {
    std::string flagsVar = "CMAKE_SHARED_LIBRARY_";
    flagsVar += lang;
    flagsVar += "_FLAGS";
    const char* flags = this->Makefile->GetSafeDefinition(flagsVar);

    if (flags && flags != originalFlags) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0018)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          e << "Variable " << flagsVar
            << " has been modified. CMake "
               "will ignore the POSITION_INDEPENDENT_CODE target property for "
               "shared libraries and will use the "
            << flagsVar
            << " variable "
               "instead.  This may cause errors if the original content of "
            << flagsVar << " was removed.\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0018);

          this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          return true;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          return false;
      }
    }
  }
  return false;
}